

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.cxx
# Opt level: O3

cmLegacyCommandWrapper * __thiscall
cmLegacyCommandWrapper::operator=(cmLegacyCommandWrapper *this,cmLegacyCommandWrapper *other)

{
  _Head_base<0UL,_cmCommand_*,_false> _Var1;
  cmLegacyCommandWrapper cVar2;
  unique_ptr<cmCommand,_std::default_delete<cmCommand>_> in_RAX;
  cmLegacyCommandWrapper local_18;
  
  local_18.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl =
       (unique_ptr<cmCommand,_std::default_delete<cmCommand>_>)
       (unique_ptr<cmCommand,_std::default_delete<cmCommand>_>)
       in_RAX._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
       super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
       super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl;
  (**(code **)((long)((other->Command)._M_t.
                      super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
                      super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
                      super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl)->_vptr_cmCommand +
              0x18))(&local_18);
  cVar2.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl =
       local_18.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
       super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
       super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl;
  local_18.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl =
       (unique_ptr<cmCommand,_std::default_delete<cmCommand>_>)
       (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)0x0;
  _Var1._M_head_impl =
       (this->Command)._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
       super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
       super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl;
  (this->Command)._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
  super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl = (cmCommand *)cVar2;
  if (_Var1._M_head_impl != (cmCommand *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_cmCommand + 8))();
    if (local_18.Command._M_t.super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t
        .super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
        super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl !=
        (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)0x0) {
      (**(code **)(*(long *)local_18.Command._M_t.
                            super___uniq_ptr_impl<cmCommand,_std::default_delete<cmCommand>_>._M_t.
                            super__Tuple_impl<0UL,_cmCommand_*,_std::default_delete<cmCommand>_>.
                            super__Head_base<0UL,_cmCommand_*,_false>._M_head_impl + 8))();
    }
  }
  return this;
}

Assistant:

cmLegacyCommandWrapper& cmLegacyCommandWrapper::operator=(
  cmLegacyCommandWrapper const& other)
{
  this->Command = other.Command->Clone();
  return *this;
}